

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_BLX_i(DisasContext_conflict1 *s,arg_BLX_i *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i32 var;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx;
  arg_BLX_i *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((s->thumb == 0) || ((a->imm & 2U) == 0)) {
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_R[0xe],(uint)(s->base).pc_next | s->thumb);
    var = tcg_const_i32_aarch64(tcg_ctx_00,(uint)((s->thumb != 0 ^ 0xffU) & 1));
    store_cpu_offset(tcg_ctx_00,var,0x220);
    uVar1 = read_pc(s);
    gen_jmp(s,(uVar1 & 0xfffffffc) + a->imm);
    s_local._7_1_ = true;
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_BLX_i(DisasContext *s, arg_BLX_i *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    /* For A32, ARCH(5) is checked near the start of the uncond block. */
    if (s->thumb && (a->imm & 2)) {
        return false;
    }
    tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_R[14], s->base.pc_next | s->thumb);
    tmp = tcg_const_i32(tcg_ctx, !s->thumb);
    store_cpu_field(tcg_ctx, tmp, thumb);
    gen_jmp(s, (read_pc(s) & ~3) + a->imm);
    return true;
}